

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# progressbar.cpp
# Opt level: O1

void __thiscall QtMWidgets::ProgressBar::paintEvent(ProgressBar *this,QPaintEvent *param_1)

{
  Orientation OVar1;
  ProgressBarPrivate *pPVar2;
  long lVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  int *piVar10;
  int *piVar11;
  int iVar12;
  double dVar13;
  double dVar14;
  QPainter p;
  QRect r;
  QRect a1;
  QRect a2;
  undefined1 local_60 [16];
  int local_50 [2];
  undefined8 local_48;
  anon_union_24_3_e3d07ef4_for_data local_40;
  undefined8 local_20;
  undefined8 local_18;
  double local_10;
  
  QPainter::QPainter((QPainter *)local_60,(QPaintDevice *)&this->field_0x10);
  pPVar2 = (this->d).d;
  lVar3 = *(long *)&pPVar2->q->field_0x20;
  iVar4 = *(int *)(lVar3 + 0x1c) - *(int *)(lVar3 + 0x14);
  iVar7 = *(int *)(lVar3 + 0x20) - *(int *)(lVar3 + 0x18);
  local_50[0] = 0;
  local_50[1] = 0;
  local_48 = CONCAT44(iVar7,iVar4);
  if (pPVar2->animate == false) {
    pPVar2->lastPaintedValue = pPVar2->value;
    OVar1 = pPVar2->orientation;
    piVar11 = (int *)&local_48;
    if (OVar1 != Horizontal) {
      piVar11 = (int *)((long)&local_48 + 4);
    }
    piVar10 = local_50;
    if (OVar1 != Horizontal) {
      piVar10 = local_50 + 1;
    }
    iVar5 = (int)((double)((*piVar11 - *piVar10) + 1) *
                 ((double)pPVar2->value / (double)(pPVar2->maximum - pPVar2->minimum)));
    local_40._0_4_ = 0;
    if ((OVar1 == Horizontal) && (local_40._0_4_ = 0, pPVar2->invertedAppearance == true)) {
      local_40._0_4_ = iVar4 - iVar5;
    }
    local_40._4_4_ = 0;
    if ((OVar1 == Vertical) && (local_40._4_4_ = 0, pPVar2->invertedAppearance == true)) {
      local_40._4_4_ = iVar7 - iVar5;
    }
    if (OVar1 == Horizontal) {
      iVar6 = pPVar2->grooveHeight;
    }
    else {
      iVar6 = iVar5;
      iVar5 = pPVar2->grooveHeight;
    }
    local_40._8_4_ = local_40._0_4_ + iVar5 + -1;
    local_40._12_4_ = local_40._4_4_ + iVar6 + -1;
    iVar9 = 0;
    if ((OVar1 == Horizontal) && (iVar9 = 0, pPVar2->invertedAppearance == false)) {
      iVar9 = iVar5;
    }
    iVar8 = 0;
    if ((OVar1 == Vertical) && (iVar8 = 0, pPVar2->invertedAppearance == false)) {
      iVar8 = iVar6;
    }
    iVar12 = 0;
    if (OVar1 == Horizontal) {
      iVar12 = 0;
      if (pPVar2->invertedAppearance != false) {
        iVar12 = -iVar5;
      }
    }
    iVar5 = 0;
    if (OVar1 == Vertical) {
      iVar5 = 0;
      if (pPVar2->invertedAppearance != false) {
        iVar5 = -iVar6;
      }
    }
    local_20 = CONCAT44(iVar8,iVar9);
    local_18 = CONCAT44(iVar5 + iVar7,iVar12 + iVar4);
    QPainter::setPen((QColor *)local_60);
    QBrush::QBrush((QBrush *)(local_60 + 8),&((this->d).d)->grooveColor,SolidPattern);
    QPainter::setBrush((QBrush *)local_60);
    QBrush::~QBrush((QBrush *)(local_60 + 8));
    QPainter::drawRects((QRect *)local_60,(int)&local_20);
    QPainter::setPen((QColor *)local_60);
    QBrush::QBrush((QBrush *)(local_60 + 8),&((this->d).d)->highlightColor,SolidPattern);
    QPainter::setBrush((QBrush *)local_60);
    QBrush::~QBrush((QBrush *)(local_60 + 8));
    QPainter::drawRects((QRect *)local_60,(int)&local_40);
  }
  else {
    QVariantAnimation::currentValue();
    local_10 = (double)QVariant::toDouble((bool *)local_40.data);
    QVariant::~QVariant((QVariant *)&local_40);
    QPainter::setPen((QColor *)local_60);
    QBrush::QBrush((QBrush *)local_40.data,&((this->d).d)->highlightColor,SolidPattern);
    QPainter::setBrush((QBrush *)local_60);
    QBrush::~QBrush((QBrush *)local_40.data);
    QPainter::drawRects((QRect *)local_60,(int)local_50);
    pPVar2 = (this->d).d;
    OVar1 = pPVar2->orientation;
    dVar13 = (double)local_50[0];
    if (OVar1 == Horizontal) {
      dVar13 = (double)pPVar2->grooveHeight +
               ((double)(((int)local_48 - local_50[0]) + 1) * local_10) / 3.0 + dVar13;
    }
    local_40._0_4_ = (undefined4)dVar13;
    dVar13 = (double)local_50[1];
    if (OVar1 != Horizontal) {
      dVar13 = (double)pPVar2->grooveHeight +
               ((double)((local_48._4_4_ - local_50[1]) + 1) * local_10) / 3.0 + dVar13;
    }
    local_40._4_4_ = (undefined4)dVar13;
    iVar4 = pPVar2->grooveHeight;
    local_40._8_4_ = local_40._0_4_ + iVar4 + -1;
    local_40._12_4_ = iVar4 + -1 + local_40._4_4_;
    dVar13 = (double)local_50[0];
    if (OVar1 == Horizontal) {
      iVar7 = ((int)local_48 - local_50[0]) + 1;
      dVar13 = (double)(iVar7 / 3) + ((double)iVar7 * local_10) / 1.5 + dVar13;
    }
    dVar14 = (double)local_50[1];
    if (OVar1 != Horizontal) {
      iVar7 = (local_48._4_4_ - local_50[1]) + 1;
      dVar14 = (double)(iVar7 / 3) + (local_10 * (double)iVar7) / 1.5 + dVar14;
    }
    local_20 = CONCAT44((int)dVar14,(int)dVar13);
    local_18 = CONCAT44((int)dVar14 + iVar4 + -1,(int)dVar13 + iVar4 + -1);
    QPainter::setPen((QColor *)local_60);
    QBrush::QBrush((QBrush *)(local_60 + 8),&((this->d).d)->animationColor,SolidPattern);
    QPainter::setBrush((QBrush *)local_60);
    QBrush::~QBrush((QBrush *)(local_60 + 8));
    QPainter::drawRects((QRect *)local_60,(int)&local_40);
    QPainter::drawRects((QRect *)local_60,(int)&local_20);
  }
  QPainter::~QPainter((QPainter *)local_60);
  return;
}

Assistant:

void
ProgressBar::paintEvent( QPaintEvent * )
{
	QPainter p( this );

	const QRect r = d->grooveRect();

	if( !d->animate )
	{
		d->lastPaintedValue = d->value;

		const int offset = (qreal) d->value / (qreal) ( d->maximum - d->minimum ) *
			( d->orientation == Qt::Horizontal ? r.width() : r.height() );

		const int x = ( ( d->orientation == Qt::Horizontal && d->invertedAppearance ) ?
			r.x() + r.width() - offset - 1 : 0 );
		const int y = ( ( d->orientation == Qt::Vertical && d->invertedAppearance ) ?
			r.y() + r.height() - offset - 1 : 0 );
		const int width = ( d->orientation == Qt::Horizontal ?
			offset : d->grooveHeight );
		const int height = ( d->orientation == Qt::Horizontal ?
			d->grooveHeight : offset );

		const QRect highlightedRect( x, y, width, height );
		const QRect baseRect = r.adjusted(
			( d->orientation == Qt::Horizontal && !d->invertedAppearance ?
				  width : 0 ),
			( d->orientation == Qt::Vertical && !d->invertedAppearance ?
				  height : 0 ),
			( d->orientation == Qt::Horizontal && d->invertedAppearance ?
				  -width : 0 ),
			( d->orientation == Qt::Vertical && d->invertedAppearance ?
				  -height : 0 ) );

		p.setPen( d->grooveColor );
		p.setBrush( d->grooveColor );

		p.drawRect( baseRect );

		p.setPen( d->highlightColor );
		p.setBrush( d->highlightColor );

		p.drawRect( highlightedRect );
	}
	else
	{
		const double value = d->animation->currentValue().toDouble();

		p.setPen( d->highlightColor );
		p.setBrush( d->highlightColor );

		p.drawRect( r );

		const QRect a1(
			( d->orientation == Qt::Horizontal ?
				r.x() + r.width() * value / 3.0 + d->grooveHeight :
				r.x() ),
			( d->orientation == Qt::Horizontal ? r.y() :
				r.y() + r.height() * value / 3.0 + d->grooveHeight ),
			d->grooveHeight, d->grooveHeight );

		const QRect a2(
			( d->orientation == Qt::Horizontal ?
				r.x() + r.width() * value / 1.5 + r.width() / 3 :
				r.x() ),
			( d->orientation == Qt::Horizontal ? r.y() :
				r.y() + r.height() * value / 1.5 + r.height() / 3 ),
			d->grooveHeight, d->grooveHeight );

		p.setPen( d->animationColor );
		p.setBrush( d->animationColor );

		p.drawRect( a1 );
		p.drawRect( a2 );
	}
}